

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O2

void ecpSWU(word *b,word *a,ec_o *ec,void *stack)

{
  word *c;
  word *pwVar1;
  word *a_00;
  word *b_00;
  qr_o *pqVar2;
  size_t n;
  bool_t bVar3;
  ulong uVar4;
  word *stack_00;
  
  pqVar2 = ec->f;
  n = pqVar2->n;
  c = (word *)((long)stack + n * 8);
  pwVar1 = c + n;
  a_00 = pwVar1 + n;
  b_00 = a_00 + n;
  stack_00 = b_00 + n;
  (*pqVar2->sqr)((word *)stack,a,pqVar2,stack_00);
  zzNegMod((word *)stack,(word *)stack,ec->f->mod,ec->f->n);
  wwCopy(b_00,ec->f->mod,n);
  zzSubW2(b_00,n,2);
  (*ec->f->sqr)(pwVar1,(word *)stack,ec->f,stack_00);
  (*ec->f->add)(pwVar1,pwVar1,(word *)stack,ec->f);
  (*ec->f->mul)(c,pwVar1,ec->A,ec->f,stack_00);
  qrPower(c,c,b_00,n,ec->f,stack_00);
  pqVar2 = ec->f;
  (*pqVar2->add)(pwVar1,pwVar1,pqVar2->unity,pqVar2);
  (*ec->f->mul)(c,c,pwVar1,ec->f,stack_00);
  (*ec->f->mul)(c,c,ec->B,ec->f,stack_00);
  zzNegMod(c,c,ec->f->mod,ec->f->n);
  (*ec->f->sqr)(pwVar1,c,ec->f,stack_00);
  (*ec->f->mul)(pwVar1,pwVar1,c,ec->f,stack_00);
  (*ec->f->mul)(a_00,c,ec->A,ec->f,stack_00);
  (*ec->f->add)(a_00,a_00,pwVar1,ec->f);
  (*ec->f->add)(a_00,a_00,ec->B,ec->f);
  (*ec->f->mul)(pwVar1,c,(word *)stack,ec->f,stack_00);
  wwCopy((word *)stack,ec->f->mod,n);
  wwShLo((word *)stack,n,2);
  zzSub(b_00,b_00,(word *)stack,n);
  qrPower((word *)stack,a_00,b_00,n,ec->f,stack_00);
  (*ec->f->sqr)(b_00,a,ec->f,stack_00);
  (*ec->f->mul)(b_00,b_00,a,ec->f,stack_00);
  (*ec->f->mul)(b_00,b_00,a_00,ec->f,stack_00);
  (*ec->f->sqr)(b,(word *)stack,ec->f,stack_00);
  (*ec->f->mul)(b,b,a_00,ec->f,stack_00);
  bVar3 = wwEq(b,ec->f->unity,ec->f->n);
  uVar4 = (long)bVar3 - 1U & n;
  wwCopy(b,c + uVar4,ec->f->n);
  (*ec->f->mul)(b + n,(word *)stack,a_00 + uVar4,ec->f,stack_00);
  return;
}

Assistant:

void ecpSWU(word b[], const word a[], const ec_o* ec, void* stack)
{
	const size_t n = ec->f->n;
	register size_t mask;
	// переменные в stack [x2 после x1, s после y!]
	word* t = (word*)stack;
	word* x1 = t + n;
	word* x2 = x1 + n;
	word* y = x2 + n;
	word* s = y + n; 
	stack = s + n;
	// pre
	ASSERT(ecIsOperable(ec));
	ASSERT(zmIsIn(a, ec->f));
	ASSERT(wwGetBits(ec->f->mod, 0, 2) == 3);
	ASSERT(!qrIsZero(ec->A, ec->f) && !qrIsZero(ec->B, ec->f));
	// t <- -a^2
	qrSqr(t, a, ec->f, stack);
	zmNeg(t, t, ec->f);
	// s <- p - 2
	wwCopy(s, ec->f->mod, n);
	zzSubW2(s, n, 2);
	// x1 <- -B(1 + t + t^2)(A(t + t^2))^{p - 2} 
	qrSqr(x2, t, ec->f, stack);
	qrAdd(x2, x2, t, ec->f);
	qrMul(x1, x2, ec->A, ec->f, stack);
	qrPower(x1, x1, s, n, ec->f, stack);
	qrAddUnity(x2, x2, ec->f);
	qrMul(x1, x1, x2, ec->f, stack);
	qrMul(x1, x1, ec->B, ec->f, stack);
	zmNeg(x1, x1, ec->f);
	// y <- (x1)^3 + A x1 + B
	qrSqr(x2, x1, ec->f, stack);
	qrMul(x2, x2, x1, ec->f, stack);
	qrMul(y, x1, ec->A, ec->f, stack);
	qrAdd(y, y, x2, ec->f);
	qrAdd(y, y, ec->B, ec->f);
	// x2 <- x1 t
	qrMul(x2, x1, t, ec->f, stack);
	// t <- y^{(p - 1) - (p + 1) / 4} = y^{s - (p - 3) / 4}
	wwCopy(t, ec->f->mod, n);
	wwShLo(t, n, 2);
	zzSub(s, s, t, n);
	qrPower(t, y, s, n, ec->f, stack);
	// s <- a^3 y
	qrSqr(s, a, ec->f, stack);
	qrMul(s, s, a, ec->f, stack);
	qrMul(s, s, y, ec->f, stack);
	// mask <- t^2 y == 1 ? 0 : -1;
	qrSqr(b, t, ec->f, stack);
	qrMul(b, b, y, ec->f, stack);
	mask = qrIsUnity(b, ec->f) - SIZE_1;
	// b <- mask == 0 ? (x1, t y) : (x2, t s)
	qrCopy(ecX(b), x1 + (mask & n), ec->f);
	qrMul(ecY(b, n), t, y + (mask & n), ec->f, stack);
	// очистка
	mask = 0;
}